

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.h
# Opt level: O2

void __thiscall wasm::TypeMapper::TypeMapper(TypeMapper *this,Module *wasm,TypeUpdates *mapping)

{
  GlobalTypeRewriter::GlobalTypeRewriter(&this->super_GlobalTypeRewriter,wasm);
  (this->super_GlobalTypeRewriter)._vptr_GlobalTypeRewriter =
       (_func_int **)&PTR__TypeMapper_0111f7e8;
  this->mapping = mapping;
  (this->newSignatures)._M_h._M_buckets = &(this->newSignatures)._M_h._M_single_bucket;
  (this->newSignatures)._M_h._M_bucket_count = 1;
  (this->newSignatures)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->newSignatures)._M_h._M_element_count = 0;
  (this->newSignatures)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->newSignatures)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->newSignatures)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

TypeMapper(Module& wasm, const TypeUpdates& mapping)
    : GlobalTypeRewriter(wasm), mapping(mapping) {}